

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodeframe_utils.c
# Opt level: O0

void update_filter_type_count(FRAME_COUNTS *counts,MACROBLOCKD *xd,MB_MODE_INFO *mbmi)

{
  InterpFilter IVar1;
  int iVar2;
  long lVar3;
  long in_RDX;
  long in_RDI;
  InterpFilter filter;
  MACROBLOCKD *unaff_retaddr;
  int ctx;
  int dir;
  undefined4 local_1c;
  
  for (local_1c = 0; local_1c < 2; local_1c = local_1c + 1) {
    iVar2 = av1_get_pred_context_switchable_interp(unaff_retaddr,(int)((ulong)in_RDI >> 0x20));
    IVar1 = av1_extract_interp_filter(*(int_interpfilters *)(in_RDX + 0x14),local_1c);
    lVar3 = in_RDI + (long)iVar2 * 0xc;
    *(int *)(lVar3 + (ulong)IVar1 * 4) = *(int *)(lVar3 + (ulong)IVar1 * 4) + 1;
  }
  return;
}

Assistant:

static inline void update_filter_type_count(FRAME_COUNTS *counts,
                                            const MACROBLOCKD *xd,
                                            const MB_MODE_INFO *mbmi) {
  int dir;
  for (dir = 0; dir < 2; ++dir) {
    const int ctx = av1_get_pred_context_switchable_interp(xd, dir);
    InterpFilter filter = av1_extract_interp_filter(mbmi->interp_filters, dir);

    // Only allow the 3 valid SWITCHABLE_FILTERS.
    assert(filter < SWITCHABLE_FILTERS);
    ++counts->switchable_interp[ctx][filter];
  }
}